

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

WithinUlpsMatcher *
Catch::Matchers::WithinULP
          (WithinUlpsMatcher *__return_storage_ptr__,double target,uint64_t maxUlpDiff)

{
  Floating::WithinUlpsMatcher::WithinUlpsMatcher(__return_storage_ptr__,target,maxUlpDiff,Double);
  return __return_storage_ptr__;
}

Assistant:

Floating::WithinUlpsMatcher WithinULP(double target, uint64_t maxUlpDiff) {
    return Floating::WithinUlpsMatcher(target, maxUlpDiff, Floating::FloatingPointKind::Double);
}